

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(CodedOutputStream *this,uint64 value)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  uint8 bytes [10];
  byte local_a [10];
  
  pbVar2 = local_a;
  uVar3 = value;
  if (0x7f < value) {
    do {
      *pbVar2 = (byte)uVar3 | 0x80;
      value = uVar3 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar3;
      uVar3 = value;
    } while (bVar1);
  }
  *pbVar2 = (byte)value;
  WriteRaw(this,local_a,((int)pbVar2 - (int)local_a) + 1);
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64SlowPath(uint64 value) {
  uint8 bytes[kMaxVarintBytes];
  uint8* target = &bytes[0];
  uint8* end = WriteVarint64ToArray(value, target);
  int size = end - target;
  WriteRaw(bytes, size);
}